

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_proj.c
# Opt level: O3

void PDHG_Restart_Iterate(CUPDLPwork *pdhg)

{
  if (pdhg->settings->eRestartMethod != PDHG_GPU_RESTART) {
    return;
  }
  PDHG_Restart_Iterate_GPU(pdhg);
  return;
}

Assistant:

void PDHG_Restart_Iterate(CUPDLPwork *pdhg) {
  switch (pdhg->settings->eRestartMethod) {
    case PDHG_WITHOUT_RESTART:
      break;
    case PDHG_GPU_RESTART:
      PDHG_Restart_Iterate_GPU(pdhg);
      break;
    case PDHG_CPU_RESTART:
      // TODO: implement PDHG_Restart_Iterate_CPU(pdhg);
      break;
  }
}